

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer.cc
# Opt level: O0

void prometheus::anon_unknown_5::WriteHead<char[5]>
               (ostream *out,MetricFamily *family,ClientMetric *metric,string *suffix,
               string *extraLabelName,char (*extraLabelValue) [5])

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  allocator local_81;
  string local_80;
  reference local_60;
  Label *lp;
  const_iterator __end3;
  const_iterator __begin3;
  vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  *__range3;
  char *prefix;
  char (*extraLabelValue_local) [5];
  string *extraLabelName_local;
  string *suffix_local;
  ClientMetric *metric_local;
  MetricFamily *family_local;
  ostream *out_local;
  
  poVar2 = std::operator<<(out,(string *)family);
  std::operator<<(poVar2,(string *)suffix);
  bVar1 = std::
          vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
          ::empty(&metric->label);
  if ((!bVar1) || (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
    std::operator<<(out,"{");
    __range3 = (vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                *)0x16ccc7;
    __end3 = std::
             vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
             ::begin(&metric->label);
    lp = (Label *)std::
                  vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                  ::end(&metric->label);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_prometheus::ClientMetric::Label_*,_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_>
                                       *)&lp), bVar1) {
      local_60 = __gnu_cxx::
                 __normal_iterator<const_prometheus::ClientMetric::Label_*,_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_>
                 ::operator*(&__end3);
      poVar2 = std::operator<<(out,(char *)__range3);
      poVar2 = std::operator<<(poVar2,(string *)local_60);
      std::operator<<(poVar2,"=\"");
      WriteValue(out,&local_60->value);
      std::operator<<(out,"\"");
      __range3 = (vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                  *)anon_var_dwarf_b91b8;
      __gnu_cxx::
      __normal_iterator<const_prometheus::ClientMetric::Label_*,_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_>
      ::operator++(&__end3);
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      poVar2 = std::operator<<(out,(char *)__range3);
      poVar2 = std::operator<<(poVar2,(string *)extraLabelName);
      std::operator<<(poVar2,"=\"");
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_80,*extraLabelValue,&local_81);
      WriteValue(out,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      std::operator<<(out,"\"");
    }
    std::operator<<(out,"}");
  }
  std::operator<<(out," ");
  return;
}

Assistant:

void WriteHead(std::ostream& out, const MetricFamily& family,
               const ClientMetric& metric, const std::string& suffix = "",
               const std::string& extraLabelName = "",
               const T& extraLabelValue = T()) {
  out << family.name << suffix;
  if (!metric.label.empty() || !extraLabelName.empty()) {
    out << "{";
    const char* prefix = "";

    for (auto& lp : metric.label) {
      out << prefix << lp.name << "=\"";
      WriteValue(out, lp.value);
      out << "\"";
      prefix = ",";
    }
    if (!extraLabelName.empty()) {
      out << prefix << extraLabelName << "=\"";
      WriteValue(out, extraLabelValue);
      out << "\"";
    }
    out << "}";
  }
  out << " ";
}